

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,ImDrawFlags flags,
          float thickness)

{
  float *pfVar1;
  float *pfVar2;
  ImVec4 *pIVar3;
  ImVec2 IVar4;
  ImVec4 *pIVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  undefined8 *puVar9;
  ImVec2 *pIVar10;
  ImDrawIdx IVar11;
  ImDrawVert *pIVar12;
  byte bVar13;
  ImDrawIdx IVar14;
  int iVar15;
  ulong uVar16;
  ImDrawIdx IVar17;
  ulong uVar18;
  ImDrawIdx *pIVar19;
  ImDrawIdx IVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ImDrawIdx IVar24;
  uint uVar25;
  bool bVar26;
  float fVar27;
  ImVec2 IVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar34;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar35;
  float fVar36;
  float afStack_a8 [2];
  undefined8 uStack_a0;
  undefined1 local_98 [8];
  float afStack_90 [10];
  ulong local_68;
  ulong local_60;
  int local_58;
  int local_54;
  float *local_50;
  uint local_44;
  ulong local_40;
  byte local_31;
  
  if (1 < points_count) {
    local_68 = (ulong)(points_count - 1U);
    IVar4 = this->_Data->TexUvWhitePixel;
    uVar23 = points_count;
    if ((flags & 1U) == 0) {
      uVar23 = points_count - 1U;
    }
    local_40 = (ulong)uVar23;
    afStack_90[6] = thickness;
    if ((this->Flags & 1U) == 0) {
      uStack_a0 = 0x12c449;
      PrimReserve(this,uVar23 * 6,uVar23 * 4);
      uVar22 = 1;
      do {
        uVar7 = uVar22 & 0xffffffff;
        if ((uint)points_count == uVar22) {
          uVar7 = 0;
        }
        fVar27 = points[uVar22 - 1].x;
        fVar30 = points[uVar7].x - fVar27;
        fVar29 = points[uVar22 - 1].y;
        auVar32._4_4_ = points[uVar7].y - fVar29;
        auVar32._0_4_ = fVar30 * fVar30 + auVar32._4_4_ * auVar32._4_4_;
        auVar32._8_8_ = 0;
        if (0.0 < auVar32._0_4_) {
          auVar33 = rsqrtss(auVar32,auVar32);
          auVar32._4_4_ = auVar32._4_4_ * auVar33._0_4_;
          fVar30 = fVar30 * auVar33._0_4_;
        }
        auVar32._4_4_ = auVar32._4_4_ * afStack_90[6] * 0.5;
        fVar30 = fVar30 * afStack_90[6] * 0.5;
        pIVar12 = this->_VtxWritePtr;
        IVar28.y = fVar29 - fVar30;
        IVar28.x = fVar27 + auVar32._4_4_;
        pIVar12->pos = IVar28;
        pIVar12->uv = IVar4;
        pIVar12 = this->_VtxWritePtr;
        pIVar12->col = col;
        pIVar12[1].pos.x = points[uVar7].x + auVar32._4_4_;
        pIVar12[1].pos.y = points[uVar7].y - fVar30;
        pIVar12[1].uv = IVar4;
        pIVar12 = this->_VtxWritePtr;
        pIVar12[1].col = col;
        pIVar12[2].pos.x = points[uVar7].x - auVar32._4_4_;
        pIVar12[2].pos.y = points[uVar7].y + fVar30;
        pIVar12[2].uv = IVar4;
        pIVar12 = this->_VtxWritePtr;
        pIVar12[2].col = col;
        pIVar12[3].pos.x = points[uVar22 - 1].x - auVar32._4_4_;
        pIVar12[3].pos.y = points[uVar22 - 1].y + fVar30;
        pIVar12[3].uv = IVar4;
        pIVar12 = this->_VtxWritePtr;
        pIVar12[3].col = col;
        this->_VtxWritePtr = pIVar12 + 4;
        uVar23 = this->_VtxCurrentIdx;
        pIVar19 = this->_IdxWritePtr;
        IVar17 = (ImDrawIdx)uVar23;
        *pIVar19 = IVar17;
        pIVar19[1] = IVar17 + 1;
        pIVar19[2] = IVar17 + 2;
        pIVar19[3] = IVar17;
        pIVar19[4] = IVar17 + 2;
        pIVar19[5] = IVar17 + 3;
        this->_IdxWritePtr = pIVar19 + 6;
        this->_VtxCurrentIdx = uVar23 + 4;
        bVar26 = uVar22 != (local_40 & 0xffffffff);
        uVar22 = uVar22 + 1;
      } while (bVar26);
    }
    else {
      afStack_90[2] = thickness;
      if (thickness <= 1.0) {
        afStack_90[2] = 1.0;
      }
      local_54 = (int)afStack_90[2];
      auVar32._4_4_ = this->_FringeScale;
      local_31 = auVar32._4_4_ == 1.0 & local_54 < 0x3f & (byte)this->Flags >> 1 &
                 afStack_90[2] - (float)local_54 <= 1e-05;
      iVar8 = 0x12;
      if (thickness <= auVar32._4_4_) {
        iVar8 = 0xc;
      }
      iVar15 = 6;
      if (local_31 == 0) {
        iVar15 = iVar8;
      }
      _local_98 = ZEXT416((uint)auVar32._4_4_);
      local_50 = (float *)CONCAT44(local_50._4_4_,flags);
      if (local_31 == 1) {
        local_58 = points_count * 2;
        local_60 = 3;
      }
      else {
        local_58 = points_count * 3;
        if (auVar32._4_4_ < thickness) {
          local_58 = points_count * 4;
        }
        local_60 = (ulong)((uint)(auVar32._4_4_ < thickness) * 2 + 3);
      }
      local_44 = col & 0xffffff;
      uStack_a0 = 0x12c695;
      PrimReserve(this,iVar15 * uVar23,local_58);
      lVar6 = -((ulong)(uint)((int)local_60 * points_count) * 8 + 0xf & 0xfffffffffffffff0);
      puVar9 = (undefined8 *)(local_98 + lVar6);
      uVar7 = (ulong)(uint)points_count;
      pfVar1 = (float *)(puVar9 + uVar7);
      uVar18 = local_40 & 0xffffffff;
      local_40 = uVar18;
      uVar22 = 1;
      do {
        uVar21 = uVar22 & 0xffffffff;
        if (uVar7 == uVar22) {
          uVar21 = 0;
        }
        auVar32._4_4_ = points[uVar21].x - points[uVar22 - 1].x;
        fVar30 = points[uVar21].y - points[uVar22 - 1].y;
        auVar33._0_4_ = auVar32._4_4_ * auVar32._4_4_ + fVar30 * fVar30;
        auVar33._4_4_ = fVar30;
        auVar33._8_8_ = 0;
        if (0.0 < auVar33._0_4_) {
          auVar33 = rsqrtss(auVar33,auVar33);
          auVar32._4_4_ = auVar32._4_4_ * auVar33._0_4_;
          fVar30 = fVar30 * auVar33._0_4_;
        }
        *(float *)(local_98 + uVar22 * 8 + lVar6 + -8) = fVar30;
        *(float *)(local_98 + uVar22 * 8 + lVar6 + -4) = -auVar32._4_4_;
        bVar26 = uVar22 != uVar18;
        uVar22 = uVar22 + 1;
      } while (bVar26);
      uVar22 = (ulong)local_50 & 1;
      local_50 = pfVar1;
      if (uVar22 == 0) {
        uVar22 = local_68 & 0xffffffff;
        puVar9[uVar22] = *(undefined8 *)(pfVar1 + -4);
        bVar13 = local_31;
        if (afStack_90[6] <= (float)local_98._0_4_ || local_31 != 0) {
          auVar32._4_4_ = (float)local_98._0_4_;
          if (local_31 != 0) {
            auVar32._4_4_ = afStack_90[2] * 0.5 + 1.0;
          }
          fVar30 = (float)*puVar9 * auVar32._4_4_;
          fVar27 = (float)((ulong)*puVar9 >> 0x20) * auVar32._4_4_;
          fVar29 = (*points).x;
          fVar31 = (*points).y;
          *(ulong *)pfVar1 = CONCAT44(fVar27 + fVar31,fVar30 + fVar29);
          *(ulong *)(pfVar1 + 2) = CONCAT44(fVar31 - fVar27,fVar29 - fVar30);
          fVar30 = points[uVar22].x;
          fVar27 = points[uVar22].y;
          uVar18 = (ulong)(uint)((int)local_68 * 2);
          *(ulong *)(pfVar1 + uVar18 * 2) =
               CONCAT44((float)((ulong)puVar9[uVar22] >> 0x20) * auVar32._4_4_ + fVar27,
                        (float)puVar9[uVar22] * auVar32._4_4_ + fVar30);
          *(ulong *)(pfVar1 + uVar18 * 2 + 2) =
               CONCAT44(fVar27 - (float)((ulong)puVar9[uVar22] >> 0x20) * auVar32._4_4_,
                        fVar30 - (float)puVar9[uVar22] * auVar32._4_4_);
          local_98._0_4_ = auVar32._4_4_;
LAB_0012c82b:
          pIVar19 = this->_IdxWritePtr;
          uVar22 = 1;
          uVar23 = this->_VtxCurrentIdx;
LAB_0012c85c:
          uVar18 = uVar22 & 0xffffffff;
          if (uVar7 == uVar22) {
            uVar18 = 0;
          }
          uVar25 = uVar23 + (bVar13 ^ 3);
          if (uVar7 == uVar22) {
            uVar25 = this->_VtxCurrentIdx;
          }
          auVar32._4_4_ =
               ((float)puVar9[uVar18] + (float)*(undefined8 *)(local_98 + uVar22 * 8 + lVar6 + -8))
               * 0.5;
          fVar30 = ((float)((ulong)puVar9[uVar18] >> 0x20) +
                   (float)((ulong)*(undefined8 *)(local_98 + uVar22 * 8 + lVar6 + -8) >> 0x20)) *
                   0.5;
          fVar27 = auVar32._4_4_ * auVar32._4_4_ + fVar30 * fVar30;
          if (1e-06 < fVar27) {
            fVar27 = 1.0 / fVar27;
            fVar29 = 100.0;
            if (fVar27 <= 100.0) {
              fVar29 = fVar27;
            }
            auVar32._4_4_ = auVar32._4_4_ * fVar29;
            fVar30 = fVar30 * fVar29;
          }
          fVar27 = points[uVar18].x;
          fVar29 = points[uVar18].y;
          pfVar2 = pfVar1 + (ulong)(uint)((int)uVar18 * 2) * 2;
          *pfVar2 = auVar32._4_4_ * (float)local_98._0_4_ + fVar27;
          pfVar2[1] = fVar30 * (float)local_98._0_4_ + fVar29;
          pfVar2[2] = fVar27 - auVar32._4_4_ * (float)local_98._0_4_;
          pfVar2[3] = fVar29 - fVar30 * (float)local_98._0_4_;
          IVar24 = (ImDrawIdx)uVar25;
          *pIVar19 = IVar24;
          IVar17 = (ImDrawIdx)uVar23;
          pIVar19[1] = IVar17;
          if (local_31 == 0) {
            pIVar19[2] = IVar17 + 2;
            pIVar19[3] = IVar17 + 2;
            pIVar19[4] = IVar24 + 2;
            pIVar19[5] = IVar24;
            pIVar19[6] = IVar24 + 1;
            pIVar19[7] = IVar17 + 1;
            pIVar19[8] = IVar17;
            pIVar19[9] = IVar17;
            pIVar19[10] = IVar24;
            pIVar19[0xb] = IVar24 + 1;
            pIVar19 = pIVar19 + 0xc;
            this->_IdxWritePtr = pIVar19;
            if (local_40 != uVar22) goto LAB_0012c96c;
            pIVar12 = this->_VtxWritePtr;
            pIVar10 = (ImVec2 *)(puVar9 + uVar7 + 1);
            uVar22 = 0;
            do {
              pIVar12->pos = points[uVar22];
              this->_VtxWritePtr->uv = IVar4;
              pIVar12 = this->_VtxWritePtr;
              pIVar12->col = col;
              pIVar12[1].pos = pIVar10[-1];
              this->_VtxWritePtr[1].uv = IVar4;
              pIVar12 = this->_VtxWritePtr;
              pIVar12[1].col = local_44;
              pIVar12[2].pos = *pIVar10;
              this->_VtxWritePtr[2].uv = IVar4;
              pIVar12 = this->_VtxWritePtr;
              pIVar12[2].col = local_44;
              pIVar12 = pIVar12 + 3;
              this->_VtxWritePtr = pIVar12;
              uVar22 = uVar22 + 1;
              pIVar10 = pIVar10 + 2;
            } while (uVar7 != uVar22);
          }
          else {
            pIVar19[2] = IVar17 + 1;
            pIVar19[3] = IVar24 + 1;
            pIVar19[4] = IVar17 + 1;
            pIVar19[5] = IVar24;
            pIVar19 = pIVar19 + 6;
            this->_IdxWritePtr = pIVar19;
            if (local_40 != uVar22) goto LAB_0012c96c;
            pIVar12 = this->_VtxWritePtr;
            pIVar5 = this->_Data->TexUvLines;
            pIVar3 = pIVar5 + local_54;
            auVar32._4_4_ = pIVar3->x;
            fVar30 = pIVar3->y;
            pIVar5 = pIVar5 + local_54;
            fVar27 = pIVar5->z;
            fVar29 = pIVar5->w;
            pIVar10 = (ImVec2 *)(puVar9 + uVar7 + 1);
            do {
              pIVar12->pos = pIVar10[-1];
              pIVar12 = this->_VtxWritePtr;
              (pIVar12->uv).x = auVar32._4_4_;
              (pIVar12->uv).y = fVar30;
              pIVar12 = this->_VtxWritePtr;
              pIVar12->col = col;
              pIVar12[1].pos = *pIVar10;
              pIVar12 = this->_VtxWritePtr;
              pIVar12[1].uv.x = fVar27;
              pIVar12[1].uv.y = fVar29;
              pIVar12 = this->_VtxWritePtr;
              pIVar12[1].col = col;
              pIVar12 = pIVar12 + 2;
              this->_VtxWritePtr = pIVar12;
              pIVar10 = pIVar10 + 2;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
          goto LAB_0012ccce;
        }
        auVar32._4_4_ = (afStack_90[2] - (float)local_98._0_4_) * 0.5;
        fVar30 = (float)local_98._0_4_ + auVar32._4_4_;
        fVar27 = (float)*puVar9;
        fVar31 = fVar30 * fVar27;
        fVar29 = (float)((ulong)*puVar9 >> 0x20);
        fVar34 = fVar30 * fVar29;
        fVar35 = (*points).x;
        fVar36 = (*points).y;
        fVar27 = fVar27 * auVar32._4_4_;
        fVar29 = fVar29 * auVar32._4_4_;
        *pfVar1 = fVar31 + fVar35;
        pfVar1[1] = fVar34 + fVar36;
        pfVar1[2] = fVar27 + fVar35;
        pfVar1[3] = fVar29 + fVar36;
        pfVar1[4] = fVar35 - fVar27;
        pfVar1[5] = fVar36 - fVar29;
        pfVar1[6] = fVar35 - fVar31;
        pfVar1[7] = fVar36 - fVar34;
        fVar27 = points[uVar22].x;
        fVar29 = points[uVar22].y;
        uVar18 = (ulong)(uint)((int)local_68 << 2);
        *(ulong *)(pfVar1 + uVar18 * 2) =
             CONCAT44((float)((ulong)puVar9[uVar22] >> 0x20) * fVar30 + fVar29,
                      (float)puVar9[uVar22] * fVar30 + fVar27);
        *(ulong *)(pfVar1 + uVar18 * 2 + 2) =
             CONCAT44((float)((ulong)puVar9[uVar22] >> 0x20) * auVar32._4_4_ + fVar29,
                      (float)puVar9[uVar22] * auVar32._4_4_ + fVar27);
        *(ulong *)(pfVar1 + uVar18 * 2 + 4) =
             CONCAT44(fVar29 - (float)((ulong)puVar9[uVar22] >> 0x20) * auVar32._4_4_,
                      fVar27 - (float)puVar9[uVar22] * auVar32._4_4_);
        *(ulong *)(pfVar1 + uVar18 * 2 + 6) =
             CONCAT44(fVar29 - (float)((ulong)puVar9[uVar22] >> 0x20) * fVar30,
                      fVar27 - (float)puVar9[uVar22] * fVar30);
      }
      else {
        if (afStack_90[6] <= (float)local_98._0_4_ || local_31 != 0) {
          bVar13 = local_31;
          if (local_31 != 0) {
            local_98._0_4_ = afStack_90[2] * 0.5 + 1.0;
          }
          goto LAB_0012c82b;
        }
        auVar32._4_4_ = (afStack_90[2] - (float)local_98._0_4_) * 0.5;
      }
      uVar22 = local_40;
      pIVar19 = this->_IdxWritePtr;
      local_40 = -local_40;
      uVar18 = 1;
      uVar23 = this->_VtxCurrentIdx;
      do {
        uVar21 = uVar18 & 0xffffffff;
        if (uVar7 == uVar18) {
          uVar21 = 0;
        }
        uVar25 = uVar23 + 4;
        if (uVar7 == uVar18) {
          uVar25 = this->_VtxCurrentIdx;
        }
        fVar30 = ((float)puVar9[uVar21] + (float)*(undefined8 *)(local_98 + uVar18 * 8 + lVar6 + -8)
                 ) * 0.5;
        fVar27 = ((float)((ulong)puVar9[uVar21] >> 0x20) +
                 (float)((ulong)*(undefined8 *)(local_98 + uVar18 * 8 + lVar6 + -8) >> 0x20)) * 0.5;
        fVar29 = fVar30 * fVar30 + fVar27 * fVar27;
        if (1e-06 < fVar29) {
          fVar29 = 1.0 / fVar29;
          fVar31 = 100.0;
          if (fVar29 <= 100.0) {
            fVar31 = fVar29;
          }
          fVar30 = fVar30 * fVar31;
          fVar27 = fVar27 * fVar31;
        }
        fVar29 = fVar30 * ((float)local_98._0_4_ + auVar32._4_4_);
        fVar31 = fVar27 * ((float)local_98._0_4_ + auVar32._4_4_);
        uVar16 = (ulong)(uint)((int)uVar21 * 4);
        fVar34 = points[uVar21].x;
        fVar35 = points[uVar21].y;
        pfVar1 = local_50 + uVar16 * 2;
        *pfVar1 = fVar29 + fVar34;
        pfVar1[1] = fVar31 + fVar35;
        pfVar1[2] = fVar30 * auVar32._4_4_ + fVar34;
        pfVar1[3] = fVar27 * auVar32._4_4_ + fVar35;
        pfVar1 = local_50 + uVar16 * 2 + 4;
        *pfVar1 = fVar34 - fVar30 * auVar32._4_4_;
        pfVar1[1] = fVar35 - fVar27 * auVar32._4_4_;
        pfVar1[2] = fVar34 - fVar29;
        pfVar1[3] = fVar35 - fVar31;
        IVar17 = (ImDrawIdx)uVar25;
        IVar14 = IVar17 + 1;
        *pIVar19 = IVar14;
        IVar24 = (ImDrawIdx)uVar23;
        pIVar19[1] = IVar24 + 1;
        IVar20 = IVar24 + 2;
        pIVar19[2] = IVar20;
        pIVar19[3] = IVar20;
        IVar11 = IVar17 + 2;
        pIVar19[4] = IVar11;
        pIVar19[5] = IVar14;
        pIVar19[6] = IVar14;
        pIVar19[7] = IVar24 + 1;
        pIVar19[8] = IVar24;
        pIVar19[9] = IVar24;
        pIVar19[10] = IVar17;
        pIVar19[0xb] = IVar14;
        pIVar19[0xc] = IVar11;
        pIVar19[0xd] = IVar20;
        pIVar19[0xe] = IVar24 + 3;
        pIVar19[0xf] = IVar24 + 3;
        pIVar19[0x10] = IVar17 + 3;
        pIVar19[0x11] = IVar11;
        pIVar19 = pIVar19 + 0x12;
        bVar26 = uVar18 != uVar22;
        uVar18 = uVar18 + 1;
        uVar23 = uVar25;
      } while (bVar26);
      this->_IdxWritePtr = pIVar19;
      pIVar12 = this->_VtxWritePtr;
      pIVar10 = (ImVec2 *)(puVar9 + uVar7 + 3);
      do {
        pIVar12->pos = pIVar10[-3];
        this->_VtxWritePtr->uv = IVar4;
        pIVar12 = this->_VtxWritePtr;
        pIVar12->col = local_44;
        pIVar12[1].pos = pIVar10[-2];
        this->_VtxWritePtr[1].uv = IVar4;
        pIVar12 = this->_VtxWritePtr;
        pIVar12[1].col = col;
        pIVar12[2].pos = pIVar10[-1];
        this->_VtxWritePtr[2].uv = IVar4;
        pIVar12 = this->_VtxWritePtr;
        pIVar12[2].col = col;
        pIVar12[3].pos = *pIVar10;
        this->_VtxWritePtr[3].uv = IVar4;
        pIVar12 = this->_VtxWritePtr;
        pIVar12[3].col = local_44;
        pIVar12 = pIVar12 + 4;
        this->_VtxWritePtr = pIVar12;
        pIVar10 = pIVar10 + 4;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
LAB_0012ccce:
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_58;
    }
  }
  return;
LAB_0012c96c:
  uVar22 = uVar22 + 1;
  uVar23 = uVar25;
  goto LAB_0012c85c;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, ImDrawFlags flags, float thickness)
{
    if (points_count < 2)
        return;

    const bool closed = (flags & ImDrawFlags_Closed) != 0;
    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}